

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_to_uint_Test::~string_to_uint_Test(string_to_uint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, to_uint)
{
    EXPECT_EQ(0U, ST_LITERAL("0").to_uint());
    EXPECT_EQ(0U, ST_LITERAL("+0").to_uint());
    EXPECT_EQ(0U, ST_LITERAL("-0").to_uint());

    EXPECT_EQ(0ULL, ST_LITERAL("0").to_ulong_long());
    EXPECT_EQ(0ULL, ST_LITERAL("+0").to_ulong_long());
    EXPECT_EQ(0ULL, ST_LITERAL("-0").to_ulong_long());

    EXPECT_EQ(80000U, ST_LITERAL("80000").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("+80000").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("0x13880").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("+0x13880").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("0234200").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("+0234200").to_uint());
    EXPECT_EQ(80000U, ST_LITERAL("13880").to_uint(16));
    EXPECT_EQ(80000U, ST_LITERAL("+13880").to_uint(16));
    EXPECT_EQ(80000U, ST_LITERAL("234200").to_uint(8));
    EXPECT_EQ(80000U, ST_LITERAL("+234200").to_uint(8));

    EXPECT_EQ(1000000000000ULL, ST_LITERAL("1000000000000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("+1000000000000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("0xe8d4a51000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("+0xe8d4a51000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("016432451210000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("+016432451210000").to_ulong_long());
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("e8d4a51000").to_ulong_long(16));
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("+e8d4a51000").to_ulong_long(16));
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("16432451210000").to_ulong_long(8));
    EXPECT_EQ(1000000000000ULL, ST_LITERAL("+16432451210000").to_ulong_long(8));

    static const unsigned int uint32_max = std::numeric_limits<unsigned int>::max();
    EXPECT_EQ(uint32_max, ST_LITERAL("4294967295").to_uint());
    EXPECT_EQ(uint32_max, ST_LITERAL("+4294967295").to_uint());
    EXPECT_EQ(uint32_max, ST_LITERAL("0xFFFFFFFF").to_uint());
    EXPECT_EQ(uint32_max, ST_LITERAL("+0xFFFFFFFF").to_uint());
    EXPECT_EQ(uint32_max, ST_LITERAL("037777777777").to_uint());
    EXPECT_EQ(uint32_max, ST_LITERAL("+037777777777").to_uint());

    static const unsigned long long uint64_max = std::numeric_limits<unsigned long long>::max();
    EXPECT_EQ(uint64_max, ST_LITERAL("18446744073709551615").to_ulong_long());
    EXPECT_EQ(uint64_max, ST_LITERAL("+18446744073709551615").to_ulong_long());
    EXPECT_EQ(uint64_max, ST_LITERAL("0xFFFFFFFFFFFFFFFF").to_ulong_long());
    EXPECT_EQ(uint64_max, ST_LITERAL("+0xFFFFFFFFFFFFFFFF").to_ulong_long());
    EXPECT_EQ(uint64_max, ST_LITERAL("01777777777777777777777").to_ulong_long());
    EXPECT_EQ(uint64_max, ST_LITERAL("+01777777777777777777777").to_ulong_long());

    // Empty string is treated as zero for compatibility with strtoul
    EXPECT_EQ(0U, ST::string().to_uint());
    EXPECT_EQ(0ULL, ST::string().to_ulong_long());
}